

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O1

void __thiscall QStyleSheetStyle::setProperties(QStyleSheetStyle *this,QWidget *w)

{
  DeclarationData *pDVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  bool bVar5;
  int *piVar6;
  Declaration *pDVar7;
  undefined8 this_00;
  char cVar8;
  CutResult CVar9;
  int iVar10;
  int iVar11;
  pointer piVar12;
  char *pcVar13;
  QSize QVar14;
  QDebug *this_01;
  ulong uVar15;
  QVariant *pQVar16;
  QPalette *this_02;
  QArrayData *pQVar17;
  storage_type_conflict *psVar18;
  __hashtable *__h;
  long lVar19;
  storage_type_conflict *psVar20;
  long lVar21;
  long in_FS_OFFSET;
  pair<std::__detail::_Node_iterator<QString,_true,_true>,_bool> pVar22;
  undefined1 auVar23 [16];
  QLatin1String QVar24;
  QStringView QVar25;
  QByteArrayView QVar26;
  QRect QVar27;
  QStringView s;
  QDuplicateTracker<QString,_32UL> propertySet;
  undefined1 local_7c8 [16];
  QArrayData *local_7b8;
  QVariant *pQStack_7b0;
  QWidgetData *local_7a8;
  QList<int> local_798;
  QArrayDataPointer<QCss::Declaration> local_778;
  QPalette local_758;
  QColor local_740;
  anon_union_24_3_e3d07ef4_for_data local_728;
  anon_union_24_3_e3d07ef4_for_data local_708;
  undefined1 *puStack_6f0;
  anon_union_24_3_e3d07ef4_for_data local_6e8;
  char *local_6d0;
  undefined1 local_6c8 [1536];
  monotonic_buffer_resource local_c8 [64];
  undefined1 local_88 [80];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_778.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_778.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_778.ptr = (Declaration *)&DAT_aaaaaaaaaaaaaaaa;
  styleRules((QList<QCss::StyleRule> *)local_6c8,this,&w->super_QObject);
  local_6e8._0_4_ = 0;
  local_6e8._4_4_ = 0;
  local_6e8._8_4_ = 0;
  local_6e8._12_4_ = 0;
  local_6e8._16_4_ = 0;
  local_6e8._20_4_ = 0;
  declarations((QList<QCss::Declaration> *)&local_778,(QList<QCss::StyleRule> *)local_6c8,
               (QString *)&local_6e8,0x100);
  piVar6 = (int *)CONCAT44(local_6e8._4_4_,local_6e8._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_6e8._4_4_,local_6e8._0_4_),2,0x10);
    }
  }
  QArrayDataPointer<QCss::StyleRule>::~QArrayDataPointer
            ((QArrayDataPointer<QCss::StyleRule> *)local_6c8);
  local_798.d.d = (Data *)0x0;
  local_798.d.ptr = (int *)0x0;
  local_798.d.size = 0;
  memcpy((QDuplicateTracker<QString,_32UL> *)local_6c8,&DAT_0067f578,0x688);
  QDuplicateTracker<QString,_32UL>::QDuplicateTracker
            ((QDuplicateTracker<QString,_32UL> *)local_6c8,local_778.size);
  if (-1 < (int)((int)local_778.size - 1U)) {
    uVar15 = (ulong)((int)local_778.size - 1U);
    do {
      pDVar1 = local_778.ptr[uVar15].d.d.ptr;
      pDVar2 = (pDVar1->property).d.d;
      local_6e8._0_4_ = SUB84(pDVar2,0);
      local_6e8._4_4_ = (undefined4)((ulong)pDVar2 >> 0x20);
      pcVar3 = (pDVar1->property).d.ptr;
      local_6e8._8_4_ = SUB84(pcVar3,0);
      local_6e8._12_4_ = (undefined4)((ulong)pcVar3 >> 0x20);
      qVar4 = (pDVar1->property).d.size;
      local_6e8._16_4_ = (undefined4)qVar4;
      local_6e8._20_4_ = (undefined4)((ulong)qVar4 >> 0x20);
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value =
             (Type)((int)(pDVar2->super_QArrayData).ref_._q_value + 1);
        UNLOCK();
      }
      QVar24.m_data = &DAT_0000000a;
      QVar24.m_size = (qsizetype)&local_6e8;
      cVar8 = QString::startsWith(QVar24,0x680168);
      if (cVar8 != '\0') {
        local_708.shared = (PrivateShared *)(local_88 + 8);
        pVar22 = std::
                 _Hashtable<QString,QString,std::pmr::polymorphic_allocator<QString>,std::__detail::_Identity,std::equal_to<QString>,QDuplicateTracker<QString,32ul>::QHasher<QString>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                 ::
                 _M_insert<QString_const&,std::__detail::_AllocNode<std::pmr::polymorphic_allocator<std::__detail::_Hash_node<QString,true>>>>
                           ((_Hashtable<QString,QString,std::pmr::polymorphic_allocator<QString>,std::__detail::_Identity,std::equal_to<QString>,QDuplicateTracker<QString,32ul>::QHasher<QString>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                             *)local_88,&local_6e8,&local_708);
        if (((undefined1  [16])pVar22 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_708._0_4_ = (int)uVar15;
          QtPrivate::QPodArrayOps<int>::emplace<int&>
                    ((QPodArrayOps<int> *)&local_798,local_798.d.size,(int *)local_708.data);
          QList<int>::end(&local_798);
        }
      }
      piVar6 = (int *)CONCAT44(local_6e8._4_4_,local_6e8._0_4_);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(local_6e8._4_4_,local_6e8._0_4_),2,0x10);
        }
      }
      bVar5 = 0 < (long)uVar15;
      uVar15 = uVar15 - 1;
    } while (bVar5);
  }
  std::
  _Hashtable<QString,_QString,_std::pmr::polymorphic_allocator<QString>,_std::__detail::_Identity,_std::equal_to<QString>,_QDuplicateTracker<QString,_32UL>::QHasher<QString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<QString,_QString,_std::pmr::polymorphic_allocator<QString>,_std::__detail::_Identity,_std::equal_to<QString>,_QDuplicateTracker<QString,_32UL>::QHasher<QString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_88);
  std::pmr::monotonic_buffer_resource::~monotonic_buffer_resource(local_c8);
  if (-1 < (int)((int)local_798.d.size - 1U)) {
    lVar19 = (ulong)((int)local_798.d.size - 1U) + 1;
    do {
      piVar12 = QList<int>::data(&local_798);
      pDVar7 = local_778.ptr;
      iVar11 = piVar12[lVar19 + -1];
      pDVar1 = local_778.ptr[iVar11].d.d.ptr;
      pcVar3 = (pDVar1->property).d.ptr;
      local_6c8[0] = '\n';
      local_6c8[1] = '\0';
      local_6c8[2] = '\0';
      local_6c8[3] = '\0';
      local_6c8[4] = '\0';
      local_6c8[5] = '\0';
      local_6c8[6] = '\0';
      local_6c8[7] = '\0';
      local_6e8._0_4_ = 0xffffffff;
      local_6e8._4_4_ = 0xffffffff;
      CVar9 = QtPrivate::QContainerImplHelper::mid
                        ((pDVar1->property).d.size,(qsizetype *)local_6c8,
                         (qsizetype *)local_6e8.data);
      if (CVar9 == Null) {
        psVar18 = (storage_type_conflict *)0x0;
        psVar20 = (storage_type_conflict *)0x0;
      }
      else {
        psVar20 = pcVar3 + CONCAT44(local_6c8._4_4_,local_6c8._0_4_);
        psVar18 = (storage_type_conflict *)CONCAT44(local_6e8._4_4_,local_6e8._0_4_);
      }
      local_7a8 = (QWidgetData *)&DAT_aaaaaaaaaaaaaaaa;
      local_7b8 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
      pQStack_7b0 = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
      QVar25.m_data = psVar18;
      QVar25.m_size = (qsizetype)&local_7b8;
      QtPrivate::convertToLatin1(QVar25);
      pcVar13 = (char *)(*(code *)**(undefined8 **)w)(w);
      iVar10 = QMetaObject::indexOfProperty(pcVar13);
      if (iVar10 == -1) {
        local_6c8[0] = '\x02';
        local_6c8[1] = '\0';
        local_6c8[2] = '\0';
        local_6c8[3] = '\0';
        local_6c8[4] = '\0';
        local_6c8[5] = '\0';
        local_6c8[6] = '\0';
        local_6c8[7] = '\0';
        local_6c8[8] = '\0';
        local_6c8[9] = '\0';
        local_6c8[10] = '\0';
        local_6c8[0xb] = '\0';
        local_6c8[0xc] = '\0';
        local_6c8[0xd] = '\0';
        local_6c8[0xe] = '\0';
        local_6c8[0xf] = '\0';
        local_6c8[0x10] = '\0';
        local_6c8[0x11] = '\0';
        local_6c8[0x12] = '\0';
        local_6c8[0x13] = '\0';
        local_6c8[0x14] = '\0';
        local_6c8[0x15] = '\0';
        local_6c8[0x16] = '\0';
        local_6c8[0x17] = '\0';
        local_6c8._24_8_ = "default";
        QMessageLogger::warning();
        ::operator<<((Stream *)&local_6e8,(QWidget *)(local_7c8 + 8));
        this_01 = QDebug::operator<<((QDebug *)&local_6e8," does not have a property named ");
        s.m_data = psVar20;
        s.m_size = (qsizetype)psVar18;
        QDebug::operator<<(this_01,s);
        QDebug::~QDebug((QDebug *)&local_6e8);
        QDebug::~QDebug((QDebug *)(local_7c8 + 8));
        goto LAB_0035b9c7;
      }
      local_6c8[0x10] = -0x56;
      local_6c8[0x11] = -0x56;
      local_6c8[0x12] = -0x56;
      local_6c8[0x13] = -0x56;
      local_6c8[0x14] = -0x56;
      local_6c8[0x15] = -0x56;
      local_6c8[0x16] = -0x56;
      local_6c8[0x17] = -0x56;
      local_6c8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_6c8[0] = -0x56;
      local_6c8[1] = -0x56;
      local_6c8[2] = -0x56;
      local_6c8[3] = -0x56;
      local_6c8[4] = -0x56;
      local_6c8[5] = -0x56;
      local_6c8[6] = -0x56;
      local_6c8[7] = -0x56;
      local_6c8[8] = -0x56;
      local_6c8[9] = -0x56;
      local_6c8[10] = -0x56;
      local_6c8[0xb] = -0x56;
      local_6c8[0xc] = -0x56;
      local_6c8[0xd] = -0x56;
      local_6c8[0xe] = -0x56;
      local_6c8[0xf] = -0x56;
      QMetaObject::property((int)local_6c8);
      cVar8 = QMetaProperty::isWritable();
      if ((cVar8 == '\0') || (cVar8 = QMetaProperty::isDesignable(), cVar8 == '\0')) {
        local_6e8._0_4_ = 2;
        local_6e8._4_4_ = 0;
        local_6e8._8_4_ = 0;
        local_6e8._12_4_ = 0;
        local_6e8._16_4_ = 0;
        local_6e8._20_4_ = 0;
        local_6d0 = "default";
        QMessageLogger::warning();
        ::operator<<((Stream *)&local_728,(QWidget *)local_7c8);
        this_00 = local_728.shared;
        QVar26.m_data = (storage_type *)0x1e;
        QVar26.m_size = (qsizetype)&local_708;
        QString::fromUtf8(QVar26);
        QTextStream::operator<<((QTextStream *)this_00,(QString *)local_708.data);
        if ((QArrayData *)local_708.shared != (QArrayData *)0x0) {
          LOCK();
          *(int *)local_708.shared = *(int *)local_708.shared + -1;
          UNLOCK();
          if (*(int *)local_708.shared == 0) {
            QArrayData::deallocate((QArrayData *)local_708.shared,2,0x10);
          }
        }
        if (*(QTextStream *)(local_728.shared + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_728.shared,' ');
        }
        QDebug::putString((QChar *)&local_728,(ulong)psVar20);
        if (*(QTextStream *)(local_728.shared + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_728.shared,' ');
        }
        QDebug::~QDebug((QDebug *)&local_728.shared);
        QDebug::~QDebug((QDebug *)local_7c8);
        goto LAB_0035b9c7;
      }
      local_6e8._0_4_ = 0;
      local_6e8._4_4_ = 0;
      local_6e8._8_4_ = 0;
      local_6e8._12_4_ = 0;
      local_6e8._16_4_ = 0;
      local_6e8._20_4_ = 0;
      local_6d0 = (char *)0x2;
      local_708._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      puStack_6f0 = &DAT_aaaaaaaaaaaaaaaa;
      local_708.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_708._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QObject::property((char *)local_708.data);
      iVar10 = ::QVariant::typeId((QVariant *)&local_708);
      switch(iVar10) {
      case 0x1001:
        QCss::Declaration::uriValue();
        QPixmap::QPixmap((QPixmap *)&local_740,&local_758,0,0);
        QPixmap::operator_cast_to_QVariant((QVariant *)&local_728,(QPixmap *)&local_740);
        ::QVariant::operator=((QVariant *)&local_6e8,(QVariant *)&local_728);
        ::QVariant::~QVariant((QVariant *)&local_728);
        QPixmap::~QPixmap((QPixmap *)&local_740);
        goto LAB_0035b81a;
      case 0x1002:
        this_02 = (QPalette *)&local_740;
        QPalette::QPalette(this_02);
        QCss::Declaration::brushValue(&local_758);
        QBrush::operator_cast_to_QVariant((QVariant *)&local_728,(QBrush *)&local_758);
        ::QVariant::operator=((QVariant *)&local_6e8,(QVariant *)&local_728);
        ::QVariant::~QVariant((QVariant *)&local_728);
        QBrush::~QBrush((QBrush *)&local_758);
        goto LAB_0035b8a5;
      case 0x1003:
        this_02 = &local_758;
        QPalette::QPalette(this_02);
        auVar23 = QCss::Declaration::colorValue((QPalette *)(pDVar7 + iVar11));
        local_740._0_8_ = auVar23._0_8_;
        local_740.ct._4_4_ = auVar23._8_4_;
        local_740.ct.argb.pad = auVar23._12_2_;
        QColor::operator_cast_to_QVariant((QVariant *)&local_728,&local_740);
        ::QVariant::operator=((QVariant *)&local_6e8,(QVariant *)&local_728);
        ::QVariant::~QVariant((QVariant *)&local_728);
LAB_0035b8a5:
        QPalette::~QPalette(this_02);
        break;
      case 0x1004:
      case 0x1007:
      case 0x1008:
      case 0x1009:
      case 0x100a:
switchD_0035b67c_caseD_1004:
        ::QVariant::operator=
                  ((QVariant *)&local_6e8,
                   (QVariant *)(*(long *)(((QPalette *)(pDVar7 + iVar11))->d + 0x30) + 8));
        break;
      case 0x1005:
        QCss::Declaration::iconValue();
        QIcon::operator_cast_to_QVariant((QVariant *)&local_728,(QIcon *)&local_740);
        ::QVariant::operator=((QVariant *)&local_6e8,(QVariant *)&local_728);
        ::QVariant::~QVariant((QVariant *)&local_728);
        QIcon::~QIcon((QIcon *)&local_740);
        break;
      case 0x1006:
        QCss::Declaration::uriValue();
        QImage::QImage((QImage *)&local_740,(QString *)&local_758,(char *)0x0);
        QImage::operator_cast_to_QVariant((QVariant *)&local_728,(QImage *)&local_740);
        ::QVariant::operator=((QVariant *)&local_6e8,(QVariant *)&local_728);
        ::QVariant::~QVariant((QVariant *)&local_728);
        QImage::~QImage((QImage *)&local_740);
LAB_0035b81a:
        if ((QArrayData *)local_758.d != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)&(local_758.d)->field_0x0)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)&(local_758.d)->field_0x0)->_q_value).super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          pQVar17 = (QArrayData *)local_758.d;
          if ((((QBasicAtomicInt *)&(local_758.d)->field_0x0)->_q_value).super___atomic_base<int>.
              _M_i == 0) {
LAB_0035b927:
            QArrayData::deallocate(pQVar17,2,0x10);
          }
        }
        break;
      case 0x100b:
        ::QVariant::toString();
        QKeySequence::QKeySequence((QKeySequence *)&local_758,(QString *)&local_740,NativeText);
        QKeySequence::operator_cast_to_QVariant((QVariant *)&local_728,(QKeySequence *)&local_758);
        ::QVariant::operator=((QVariant *)&local_6e8,(QVariant *)&local_728);
        ::QVariant::~QVariant((QVariant *)&local_728);
        QKeySequence::~QKeySequence((QKeySequence *)&local_758);
        if ((QArrayData *)local_740._0_8_ == (QArrayData *)0x0) break;
        LOCK();
        (((QBasicAtomicInt *)local_740._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_740._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        pQVar17 = (QArrayData *)local_740._0_8_;
        if ((((QBasicAtomicInt *)local_740._0_8_)->_q_value).super___atomic_base<int>._M_i != 0)
        break;
        goto LAB_0035b927;
      default:
        if (iVar10 == 0x13) {
          QVar27 = (QRect)QCss::Declaration::rectValue();
          ::QVariant::QVariant((QVariant *)&local_728,QVar27);
        }
        else {
          if (iVar10 != 0x15) goto switchD_0035b67c_caseD_1004;
          QVar14 = (QSize)QCss::Declaration::sizeValue();
          ::QVariant::QVariant((QVariant *)&local_728,QVar14);
        }
        ::QVariant::operator=((QVariant *)&local_6e8,(QVariant *)&local_728);
        ::QVariant::~QVariant((QVariant *)&local_728);
      }
      if (((local_7a8 != (QWidgetData *)&DAT_0000000a) ||
          (iVar11 = bcmp(pQStack_7b0,"styleSheet",10), iVar11 != 0)) ||
         (cVar8 = ::QVariant::equals((QVariant *)&local_708), cVar8 == '\0')) {
        pQVar16 = pQStack_7b0;
        if (pQStack_7b0 == (QVariant *)0x0) {
          pQVar16 = (QVariant *)&QByteArray::_empty;
        }
        QObject::doSetProperty((char *)w,pQVar16,(QVariant *)&local_6e8);
      }
      ::QVariant::~QVariant((QVariant *)&local_708);
      ::QVariant::~QVariant((QVariant *)&local_6e8);
LAB_0035b9c7:
      if (local_7b8 != (QArrayData *)0x0) {
        LOCK();
        (local_7b8->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_7b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_7b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_7b8,1,0x10);
        }
      }
      lVar21 = lVar19 + -1;
      bVar5 = 0 < lVar19;
      lVar19 = lVar21;
    } while (lVar21 != 0 && bVar5);
  }
  if (&(local_798.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_798.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_798.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_798.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_798.d.d)->super_QArrayData,4,0x10);
    }
  }
  QArrayDataPointer<QCss::Declaration>::~QArrayDataPointer(&local_778);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QStyleSheetStyle::setProperties(QWidget *w)
{
    // The final occurrence of each property is authoritative.
    // Set value for each property in the order of property final occurrence
    // since properties interact.

    const QList<Declaration> decls = declarations(styleRules(w), QString());
    QList<int> finals; // indices in reverse order of each property's final occurrence

    {
        // scan decls for final occurrence of each "qproperty"
        QDuplicateTracker<QString> propertySet(decls.size());
        for (int i = decls.size() - 1; i >= 0; --i) {
            const QString property = decls.at(i).d->property;
            if (!property.startsWith("qproperty-"_L1, Qt::CaseInsensitive))
                continue;
            if (!propertySet.hasSeen(property))
                finals.append(i);
        }
    }

    for (int i = finals.size() - 1; i >= 0; --i) {
        const Declaration &decl = decls.at(finals[i]);
        QStringView property = decl.d->property;
        property = property.mid(10); // strip "qproperty-"
        const auto propertyL1 = property.toLatin1();

        const QMetaObject *metaObject = w->metaObject();
        int index = metaObject->indexOfProperty(propertyL1);
        if (Q_UNLIKELY(index == -1)) {
            qWarning() << w << " does not have a property named " << property;
            continue;
        }
        const QMetaProperty metaProperty = metaObject->property(index);
        if (Q_UNLIKELY(!metaProperty.isWritable() || !metaProperty.isDesignable())) {
            qWarning() << w << " cannot design property named " << property;
            continue;
        }

        QVariant v;
        const QVariant value = w->property(propertyL1);
        switch (value.userType()) {
        case QMetaType::QIcon: v = decl.iconValue(); break;
        case QMetaType::QImage: v = QImage(decl.uriValue()); break;
        case QMetaType::QPixmap: v = QPixmap(decl.uriValue()); break;
        case QMetaType::QRect: v = decl.rectValue(); break;
        case QMetaType::QSize: v = decl.sizeValue(); break;
        case QMetaType::QColor: v = decl.colorValue(); break;
        case QMetaType::QBrush: v = decl.brushValue(); break;
#ifndef QT_NO_SHORTCUT
        case QMetaType::QKeySequence: v = QKeySequence(decl.d->values.at(0).variant.toString()); break;
#endif
        default: v = decl.d->values.at(0).variant; break;
        }

        if (propertyL1 == QByteArrayView("styleSheet") && value == v)
            continue;

        w->setProperty(propertyL1, v);
    }
}